

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O0

int testNumberOfNeighborsWithDefaultValueInSet(void)

{
  bool bVar1;
  Int64Set *pIVar2;
  ostream *poVar3;
  Result local_98;
  SingleKdTreeIndex *kdTree;
  NearestNeighborsIndex *nnIndex;
  Int64Parameter *numberOfNeighbors;
  KNearestNeighborsClassifier *knnClassifier;
  undefined1 local_40 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  CoreML::KNNValidatorTests::generateInterface((Model *)local_40);
  numberOfNeighbors =
       (Int64Parameter *)
       CoreML::Specification::Model::mutable_knearestneighborsclassifier((Model *)local_40);
  nnIndex = (NearestNeighborsIndex *)
            CoreML::Specification::KNearestNeighborsClassifier::mutable_numberofneighbors
                      ((KNearestNeighborsClassifier *)numberOfNeighbors);
  pIVar2 = CoreML::Specification::Int64Parameter::mutable_set((Int64Parameter *)nnIndex);
  CoreML::Specification::Int64Set::add_values(pIVar2,1);
  pIVar2 = CoreML::Specification::Int64Parameter::mutable_set((Int64Parameter *)nnIndex);
  CoreML::Specification::Int64Set::add_values(pIVar2,4);
  pIVar2 = CoreML::Specification::Int64Parameter::mutable_set((Int64Parameter *)nnIndex);
  CoreML::Specification::Int64Set::add_values(pIVar2,7);
  CoreML::Specification::Int64Parameter::set_defaultvalue((Int64Parameter *)nnIndex,4);
  CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting
            ((KNearestNeighborsClassifier *)numberOfNeighbors);
  kdTree = (SingleKdTreeIndex *)
           CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex
                     ((KNearestNeighborsClassifier *)numberOfNeighbors);
  CoreML::Specification::NearestNeighborsIndex::mutable_squaredeuclideandistance
            ((NearestNeighborsIndex *)kdTree);
  local_98.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NearestNeighborsIndex::mutable_singlekdtreeindex
                 ((NearestNeighborsIndex *)kdTree);
  CoreML::Specification::SingleKdTreeIndex::set_leafsize
            ((SingleKdTreeIndex *)local_98.m_message._M_storage._M_storage,0x1e);
  CoreML::Specification::KNearestNeighborsClassifier::set_defaultstringlabel
            ((KNearestNeighborsClassifier *)numberOfNeighbors,"Default");
  CoreML::validate<(MLModelType)404>(&local_98,(Model *)local_40);
  bVar1 = CoreML::Result::good(&local_98);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1ff);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"(res).good()");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  m1._oneof_case_[0]._0_1_ = !bVar1;
  CoreML::Result::~Result(&local_98);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m1._oneof_case_[0];
}

Assistant:

int testNumberOfNeighborsWithDefaultValueInSet() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    auto *numberOfNeighbors = knnClassifier->mutable_numberofneighbors();
    numberOfNeighbors->mutable_set()->add_values(1);
    numberOfNeighbors->mutable_set()->add_values(4);
    numberOfNeighbors->mutable_set()->add_values(7);
    numberOfNeighbors->set_defaultvalue(4);

    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    knnClassifier->set_defaultstringlabel("Default");

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);

    return 0;

}